

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_vif_linux.c
# Opt level: O0

void os_vif_linux_close(os_vif *vif)

{
  os_fd *poVar1;
  bool bVar2;
  os_vif *vif_local;
  int result;
  
  bVar2 = false;
  if ((vif->_vif_node).list.next != (list_entity *)0x0) {
    bVar2 = (vif->_vif_node).list.prev != (list_entity *)0x0;
  }
  if (bVar2) {
    poVar1 = vif->fd;
    if (poVar1->fd != -1) {
      close(poVar1->fd);
      poVar1->fd = -1;
    }
    avl_remove(&_vif_tree,&vif->_vif_node);
  }
  return;
}

Assistant:

void
os_vif_linux_close(struct os_vif *vif) {
  if (avl_is_node_added(&vif->_vif_node)) {
    os_fd_close(vif->fd);
    avl_remove(&_vif_tree, &vif->_vif_node);
  }
}